

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

bool check_div_uint32_int32(uint32_t a,int32_t b,uint32_t *ret)

{
  uint32_t uVar1;
  uint *in_RDX;
  uint in_ESI;
  uint in_EDI;
  uint32_t tmp;
  undefined1 local_1;
  
  if (in_ESI == 0) {
    local_1 = false;
  }
  else if (in_EDI == 0) {
    *in_RDX = 0;
    local_1 = true;
  }
  else if ((int)in_ESI < 1) {
    uVar1 = safe_abs32(in_ESI);
    if (in_EDI < uVar1) {
      *in_RDX = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    *in_RDX = in_EDI / in_ESI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool check_div_uint32_int32(uint32_t a, int32_t b, uint32_t* ret)
{
    // Follow original SafeInt logic for this case
    if (b == 0) // div 0 always a problem
    {
        return false;
    }

    if (a == 0) // zero divided by anything is zero
    {
        *ret = 0;
        return true;
    }

    if (b > 0) // if b is positive, just do the math
    {
        *ret = (a / (uint32_t)b);
        return true;
    }
    else // now have to check magnitude
    {
        uint32_t tmp = safe_abs32(b);

        if (a < tmp)
        {
            *ret = 0;
            return true;
        }
    }

    return false;
}